

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter_tests.c
# Opt level: O1

_Bool compare_xmlNode_has_attribute_equal_to(Constraint *constraint,CgreenValue actual)

{
  undefined8 *puVar1;
  int iVar2;
  xmlChar *pxVar3;
  
  puVar1 = (undefined8 *)(constraint->expected_value).value.pointer_value;
  pxVar3 = getAttribute((xmlNodePtr)actual.value.pointer_value,(xmlChar *)*puVar1);
  iVar2 = xmlStrEqual(pxVar3,puVar1[1]);
  (*_xmlFree)(pxVar3);
  return iVar2 != 0;
}

Assistant:

static bool compare_xmlNode_has_attribute_equal_to(Constraint *constraint,
                                                   CgreenValue actual) {
    xmlNodePtr actualNode =  (xmlNodePtr)actual.value.pointer_value;
    struct xmlNode_has_attribute_equal_to *expected =
        (struct xmlNode_has_attribute_equal_to*)constraint->expected_value.value.pointer_value;
    xmlChar* actualValue = getAttribute(actualNode, expected->attr);

    bool ret = xmlStrEqual(actualValue, expected->value);
    xmlFree(actualValue);
    return ret;
}